

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3SelectPopWith(Walker *pWalker,Select *p)

{
  long lVar1;
  Select *pSVar2;
  Select *in_RSI;
  long *in_RDI;
  With *pWith;
  Parse *pParse;
  
  lVar1 = *in_RDI;
  if ((*(long *)(lVar1 + 0x198) != 0) && (in_RSI->pPrior == (Select *)0x0)) {
    pSVar2 = findRightmost(in_RSI);
    if (pSVar2->pWith != (With *)0x0) {
      *(With **)(lVar1 + 0x198) = pSVar2->pWith->pOuter;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3SelectPopWith(Walker *pWalker, Select *p){
  Parse *pParse = pWalker->pParse;
  if( OK_IF_ALWAYS_TRUE(pParse->pWith) && p->pPrior==0 ){
    With *pWith = findRightmost(p)->pWith;
    if( pWith!=0 ){
      assert( pParse->pWith==pWith || pParse->nErr );
      pParse->pWith = pWith->pOuter;
    }
  }
}